

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMatrixUtil.cpp
# Opt level: O2

void ZXing::QRCode::BuildMatrix
               (BitArray *dataBits,ErrorCorrectionLevel ecLevel,Version *version,int maskPattern,
               TritMatrix *matrix)

{
  uint uVar1;
  uint uVar2;
  pointer pTVar3;
  uint *puVar4;
  uint *puVar5;
  value_t vVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  invalid_argument *piVar10;
  logic_error *plVar11;
  int iVar12;
  int i_1;
  int iVar13;
  undefined8 *puVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  pointer pTVar19;
  long lVar20;
  uint *puVar21;
  int iVar22;
  int i;
  ulong uVar23;
  uint *puVar24;
  int local_100;
  string local_f8;
  BitArray maskBits;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long local_58;
  string local_50;
  
  Matrix<ZXing::Trit>::clear(matrix,(value_t)0x2);
  EmbedPositionDetectionPattern(0,0,matrix);
  EmbedPositionDetectionPattern(matrix->_width + -7,0,matrix);
  EmbedPositionDetectionPattern(0,matrix->_width + -7,matrix);
  iVar9 = matrix->_width;
  local_58 = (long)iVar9;
  (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
  super__Vector_impl_data._M_start[((long)matrix->_height + -8) * local_58 + 8].value = true_v;
  if (1 < version->_versionNumber) {
    puVar5 = (uint *)(version->_alignmentPatternCenters).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
    puVar4 = (uint *)(version->_alignmentPatternCenters).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
    for (puVar21 = puVar4; puVar21 != puVar5; puVar21 = puVar21 + 1) {
      uVar1 = *puVar21;
      iVar16 = matrix->_height;
      iVar22 = matrix->_width;
      pTVar3 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl
               .super__Vector_impl_data._M_start;
      for (puVar24 = puVar4; puVar24 != puVar5; puVar24 = puVar24 + 1) {
        uVar2 = *puVar24;
        if (uVar2 != 6 || (uVar1 ^ 6) != 0) {
          if ((uVar2 != 6 || iVar16 - 7U != uVar1) && (uVar2 != iVar22 - 7U || (uVar1 ^ 6) != 0)) {
            pTVar19 = pTVar3 + (long)(int)uVar2 + (long)(int)(uVar1 - 2) * (long)iVar22;
            for (lVar20 = 0; lVar20 != 5; lVar20 = lVar20 + 1) {
              uVar17 = (int)lVar20 - 2;
              lVar15 = -2;
              uVar2 = -uVar17;
              if (0 < (int)uVar17) {
                uVar2 = uVar17;
              }
              for (; lVar15 != 3; lVar15 = lVar15 + 1) {
                uVar18 = (uint)lVar15;
                uVar17 = -uVar18;
                if (0 < (int)uVar18) {
                  uVar17 = uVar18;
                }
                if (uVar17 <= uVar2) {
                  uVar17 = uVar2;
                }
                pTVar19[lVar15].value = uVar17 != 1;
              }
              pTVar19 = pTVar19 + iVar22;
            }
          }
        }
      }
    }
  }
  pTVar3 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar19 = pTVar3 + local_58 * 8 + 6;
  for (lVar20 = 8; lVar20 < local_58 + -8; lVar20 = lVar20 + 1) {
    vVar6 = ~(byte)lVar20 & true_v;
    pTVar3[lVar20 + iVar9 * 6].value = vVar6;
    pTVar19->value = vVar6;
    pTVar19 = pTVar19 + local_58;
  }
  if (7 < (uint)maskPattern) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar10,"Invalid mask pattern");
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  iVar9 = BitsFromECLevel(ecLevel);
  iVar9 = maskPattern + iVar9 * 8;
  BitArray::appendBits((BitArray *)&local_f8,iVar9,5);
  iVar9 = CalculateBCHCode(iVar9,0x537);
  BitArray::appendBits((BitArray *)&local_f8,iVar9,10);
  maskBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  maskBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  maskBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BitArray::appendBits(&maskBits,0x5412,0xf);
  BitArray::bitwiseXOR((BitArray *)&local_f8,&maskBits);
  if ((int)local_f8._M_string_length - (int)local_f8._M_dataplus._M_p != 0xf) {
    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string
              (&local_98,(int)local_f8._M_string_length - (int)local_f8._M_dataplus._M_p);
    std::operator+(&local_78,"Should not happen but we got: ",&local_98);
    std::logic_error::logic_error(plVar11,(string *)&local_78);
    __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&maskBits);
  puVar14 = &DAT_001a9df0;
  iVar9 = -1;
  for (uVar23 = 0; iVar16 = (int)local_f8._M_string_length - (int)local_f8._M_dataplus._M_p,
      (long)uVar23 < (long)iVar16; uVar23 = uVar23 + 1) {
    bVar7 = BitArray::get((BitArray *)&local_f8,iVar16 + iVar9);
    iVar16 = matrix->_width;
    pTVar3 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar3[(int)((ulong)*puVar14 >> 0x20) * iVar16 + (int)*puVar14].value = bVar7;
    if (uVar23 < 8) {
      lVar20 = (long)(iVar16 * 9 + iVar9);
    }
    else {
      lVar20 = (long)((matrix->_height + (int)uVar23 + -0xf) * iVar16) + 8;
    }
    pTVar3[lVar20].value = bVar7;
    puVar14 = puVar14 + 1;
    iVar9 = iVar9 + -1;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
  if (6 < version->_versionNumber) {
    maskBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    maskBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    maskBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BitArray::appendBits(&maskBits,version->_versionNumber,6);
    iVar9 = CalculateBCHCode(version->_versionNumber,0x1f25);
    BitArray::appendBits(&maskBits,iVar9,0xc);
    if ((int)maskBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
        (int)maskBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start != 0x12) {
      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string
                (&local_98,
                 (int)maskBits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)maskBits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      std::operator+(&local_78,"Should not happen but we got: ",&local_98);
      std::logic_error::logic_error(plVar11,(string *)&local_78);
      __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    iVar9 = 0x11;
    for (iVar16 = 0; iVar16 != 6; iVar16 = iVar16 + 1) {
      for (iVar22 = -0xb; iVar22 != -8; iVar22 = iVar22 + 1) {
        bVar7 = BitArray::get(&maskBits,iVar9);
        iVar9 = iVar9 + -1;
        iVar13 = matrix->_width;
        iVar12 = matrix->_height + iVar22;
        pTVar3 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar3[iVar12 * iVar13 + iVar16].value = bVar7;
        pTVar3[iVar13 * iVar16 + iVar12].value = bVar7;
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&maskBits);
  }
  iVar16 = matrix->_width;
  iVar22 = matrix->_height;
  iVar13 = iVar16 + -1;
  iVar9 = iVar22 + -1;
  local_100 = -1;
  iVar12 = 0;
  while (0 < iVar13) {
    if (iVar13 == 6) {
      iVar13 = 5;
    }
    lVar20 = (long)iVar13;
    iVar13 = iVar13 + -2;
    for (; (-1 < iVar9 && (lVar15 = lVar20, iVar9 < iVar22)); iVar9 = iVar9 + local_100) {
      for (; iVar22 = (int)lVar15, iVar13 < iVar22; lVar15 = lVar15 + -1) {
        if ((matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9 * iVar16 + iVar22].value == empty_v) {
          if (iVar12 < *(int *)&(dataBits->_bits).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                       *(int *)&(dataBits->_bits).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start) {
            bVar7 = BitArray::get(dataBits,iVar12);
          }
          else {
            bVar7 = false;
          }
          iVar12 = iVar12 + 1;
          bVar8 = GetDataMaskBit(maskPattern,iVar22,iVar9,false);
          iVar16 = matrix->_width;
          (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
          super__Vector_impl_data._M_start[lVar15 + iVar9 * iVar16].value = bVar8 ^ bVar7;
        }
      }
      iVar22 = matrix->_height;
    }
    iVar9 = iVar9 - local_100;
    local_100 = -local_100;
  }
  if (iVar12 < *(int *)&(dataBits->_bits).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
               *(int *)&(dataBits->_bits).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_f8,iVar12);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maskBits,
                   "Not all bits consumed: ",&local_f8);
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maskBits,
                   '/');
    std::__cxx11::to_string
              (&local_50,
               *(int *)&(dataBits->_bits).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
               *(int *)&(dataBits->_bits).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
    std::operator+(&local_78,&local_98,&local_50);
    std::invalid_argument::invalid_argument(piVar10,(string *)&local_78);
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void BuildMatrix(const BitArray& dataBits, ErrorCorrectionLevel ecLevel, const Version& version, int maskPattern, TritMatrix& matrix)
{
	matrix.clear();
	// Let's get started with embedding big squares at corners.
	EmbedPositionDetectionPatternsAndSeparators(matrix);
	// Then, embed the dark dot at the left bottom corner.
	EmbedDarkDotAtLeftBottomCorner(matrix);
	// Position adjustment patterns appear if version >= 2.
	EmbedPositionAdjustmentPatterns(version, matrix);
	// Timing patterns should be embedded after position adj. patterns.
	EmbedTimingPatterns(matrix);
	// Type information appear with any version.
	EmbedTypeInfo(ecLevel, maskPattern, matrix);
	// Version info appear if version >= 7.
	EmbedVersionInfo(version, matrix);
	// Data should be embedded at end.
	EmbedDataBits(dataBits, maskPattern, matrix);
}